

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

void __thiscall
QSslSocket::connectToHostEncrypted
          (QSslSocket *this,QString *hostName,quint16 port,OpenMode mode,
          NetworkLayerProtocol protocol)

{
  QSslSocketPrivate *this_00;
  bool bVar1;
  QLoggingCategory *pQVar2;
  char *ctx;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSslSocketPrivate **)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  if (((this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.state & ~HostLookupState) ==
      ConnectingState) {
    pQVar2 = QtPrivateLogging::lcSsl();
    if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_40 = pQVar2->name;
      local_58.d._0_4_ = 2;
      local_58._4_8_ = 0;
      local_58._12_8_ = 0;
      local_58.size._4_4_ = 0;
      QMessageLogger::warning
                ((char *)&local_58,
                 "QSslSocket::connectToHostEncrypted() called when already connecting/connected");
    }
  }
  else {
    bVar1 = QSslSocketPrivate::supportsSsl();
    if (bVar1) {
      ctx = "QSslSocket::connectToHostEncrypted:";
      bVar1 = QSslSocketPrivate::verifyProtocolSupported
                        (this_00,"QSslSocket::connectToHostEncrypted:");
      if (bVar1) {
        QSslSocketPrivate::init(this_00,(EVP_PKEY_CTX *)ctx);
        this_00->autoStartHandshake = true;
        (this_00->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.field_0x26f = 1;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          (**(code **)(*(long *)&(this->super_QTcpSocket).super_QAbstractSocket + 0xf8))
                    (this,hostName,port,
                     mode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
                     super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i,protocol);
          return;
        }
        goto LAB_0022fdef;
      }
    }
    else {
      pQVar2 = QtPrivateLogging::lcSsl();
      if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_40 = pQVar2->name;
        local_58.d._0_4_ = 2;
        local_58._4_8_ = 0;
        local_58._12_8_ = 0;
        local_58.size._4_4_ = 0;
        QMessageLogger::warning
                  ((char *)&local_58,"QSslSocket::connectToHostEncrypted: TLS initialization failed"
                  );
      }
      tr((QString *)&local_58,"TLS initialization failed",(char *)0x0,-1);
      QAbstractSocketPrivate::setErrorAndEmit
                ((QAbstractSocketPrivate *)this_00,SslInternalError,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0022fdef:
  __stack_chk_fail();
}

Assistant:

void QSslSocket::connectToHostEncrypted(const QString &hostName, quint16 port, OpenMode mode, NetworkLayerProtocol protocol)
{
    Q_D(QSslSocket);
    if (d->state == ConnectedState || d->state == ConnectingState) {
        qCWarning(lcSsl,
                  "QSslSocket::connectToHostEncrypted() called when already connecting/connected");
        return;
    }

    if (!supportsSsl()) {
        qCWarning(lcSsl, "QSslSocket::connectToHostEncrypted: TLS initialization failed");
        d->setErrorAndEmit(QAbstractSocket::SslInternalError, tr("TLS initialization failed"));
        return;
    }

    if (!d->verifyProtocolSupported("QSslSocket::connectToHostEncrypted:"))
        return;

    d->init();
    d->autoStartHandshake = true;
    d->initialized = true;

    // Note: When connecting to localhost, some platforms (e.g., HP-UX and some BSDs)
    // establish the connection immediately (i.e., first attempt).
    connectToHost(hostName, port, mode, protocol);
}